

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

RepeatedField<unsigned_long> * __thiscall
google::protobuf::RepeatedField<unsigned_long>::operator=
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  unsigned_long *puVar6;
  void **ppvVar7;
  
  if (this != other) {
    if (this->total_size_ == 0) {
      ppvVar7 = &this->arena_or_elements_;
    }
    else {
      puVar6 = elements(this);
      ppvVar7 = (void **)(puVar6 + -1);
    }
    pvVar1 = *ppvVar7;
    if (other->total_size_ == 0) {
      ppvVar7 = &other->arena_or_elements_;
    }
    else {
      puVar6 = elements(other);
      ppvVar7 = (void **)(puVar6 + -1);
    }
    if (pvVar1 == *ppvVar7) {
      iVar4 = this->current_size_;
      iVar5 = this->total_size_;
      pvVar1 = this->arena_or_elements_;
      iVar3 = other->total_size_;
      pvVar2 = other->arena_or_elements_;
      this->current_size_ = other->current_size_;
      this->total_size_ = iVar3;
      this->arena_or_elements_ = pvVar2;
      other->current_size_ = iVar4;
      other->total_size_ = iVar5;
      other->arena_or_elements_ = pvVar1;
    }
    else {
      this->current_size_ = 0;
      MergeFrom(this,other);
    }
  }
  return this;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    RepeatedField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (GetArena() != other.GetArena()
#ifdef PROTOBUF_FORCE_COPY_IN_MOVE
        || GetArena() == nullptr
#endif  // !PROTOBUF_FORCE_COPY_IN_MOVE
    ) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}